

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O1

void anon_unknown.dwarf_11d4c7::destroyStaleFBOs(void)

{
  undefined8 in_RAX;
  Uint64 UVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  const_iterator __position;
  GLuint frameBuffer;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  UVar1 = sf::Context::getActiveContextId();
  __position._M_node = (_Base_ptr)(anonymous_namespace)::staleFrameBuffers._24_8_;
  if ((anonymous_namespace)::staleFrameBuffers._24_8_ != 0x22f0c0) {
    do {
      if (*(Uint64 *)(__position._M_node + 1) == UVar1) {
        uStack_38 = CONCAT44(*(undefined4 *)&__position._M_node[1]._M_parent,(undefined4)uStack_38);
        (*sf_ptrc_glDeleteFramebuffersEXT)(1,(GLuint *)((long)&uStack_38 + 4));
        sf::priv::glCheckError
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x44,"GLEXT_glDeleteFramebuffers(1, &frameBuffer)");
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<std::pair<unsigned_long_long,unsigned_int>,std::pair<unsigned_long_long,unsigned_int>,std::_Identity<std::pair<unsigned_long_long,unsigned_int>>,std::less<std::pair<unsigned_long_long,unsigned_int>>,std::allocator<std::pair<unsigned_long_long,unsigned_int>>>
        ::erase_abi_cxx11_((_Rb_tree<std::pair<unsigned_long_long,unsigned_int>,std::pair<unsigned_long_long,unsigned_int>,std::_Identity<std::pair<unsigned_long_long,unsigned_int>>,std::less<std::pair<unsigned_long_long,unsigned_int>>,std::allocator<std::pair<unsigned_long_long,unsigned_int>>>
                            *)(anonymous_namespace)::staleFrameBuffers,__position);
      }
      else {
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      __position._M_node = p_Var2;
    } while (p_Var2 != (_Base_ptr)((anonymous_namespace)::staleFrameBuffers + 8));
  }
  return;
}

Assistant:

void destroyStaleFBOs()
    {
        sf::Uint64 contextId = sf::Context::getActiveContextId();

        for (std::set<std::pair<sf::Uint64, unsigned int> >::iterator iter = staleFrameBuffers.begin(); iter != staleFrameBuffers.end();)
        {
            if (iter->first == contextId)
            {
                GLuint frameBuffer = static_cast<GLuint>(iter->second);
                glCheck(GLEXT_glDeleteFramebuffers(1, &frameBuffer));

                staleFrameBuffers.erase(iter++);
            }
            else
            {
                ++iter;
            }
        }
    }